

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::handleErroEvent(Connection *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  shared_ptr<Liby::Connection> x;
  Connection *this_local;
  
  x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::enable_shared_from_this<Liby::Connection>::shared_from_this
            ((enable_shared_from_this<Liby::Connection> *)local_20);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->erroEventCallback_);
  if (bVar1) {
    std::function<void_(Liby::Connection_&)>::operator()(&this->erroEventCallback_,this);
  }
  destroy(this);
  std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)local_20);
  return;
}

Assistant:

void Connection::handleErroEvent() {
    auto x = shared_from_this();
    if (erroEventCallback_) {
        erroEventCallback_(*this);
    }
    destroy();
}